

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::find
          (ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *this,
          uint id)

{
  ImportClient *pIVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar2;
  long local_18;
  
  lVar2 = CONCAT44(in_register_00000034,id);
  if (in_EDX < 0x10) {
    if ((*(uint *)(lVar2 + 0x200) >> (in_EDX & 0x1f) & 1) == 0) {
      this->low[0].importClient.ptr = (ImportClient *)0x0;
    }
    else {
      this->low[0].importClient.ptr = (ImportClient *)(lVar2 + (ulong)in_EDX * 0x20);
    }
  }
  else {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>>
                *)&local_18,(uint *)(lVar2 + 0x208));
    pIVar1 = (ImportClient *)(local_18 + 8);
    if (local_18 == 0) {
      pIVar1 = (ImportClient *)0x0;
    }
    this->low[0].importClient.ptr = pIVar1;
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&>)this->low;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    // Look up an entry, returning null if it doesn't exist.
    if (id < kj::size(low)) {
      if (presenceBits & (1 << id)) {
        return low[id];
      } else {
        return kj::none;
      }
    } else {
      return high.find(id);
    }
  }